

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall
QTreeView::drawBranches(QTreeView *this,QPainter *painter,QRect *rect,QModelIndex *index)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  ScrollMode SVar14;
  SelectionBehavior SVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  QStyle *pQVar19;
  QFlagsStorage<QStyle::StateFlag> QVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint *puVar25;
  long in_FS_OFFSET;
  int local_1a0;
  int local_19c;
  long local_198;
  QAbstractItemModel *local_190;
  QModelIndex local_188;
  QPoint local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_158;
  undefined1 *local_148;
  undefined1 *puStack_140;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_138;
  undefined1 *local_128;
  undefined1 *puStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  bVar10 = QWidget::isRightToLeft((QWidget *)this);
  iVar18 = *(int *)(lVar7 + 0x598);
  bVar1 = *(byte *)(lVar7 + 0x5c1);
  iVar3 = *(int *)(lVar7 + 0x5d0);
  lVar8 = *(long *)(lVar7 + 0x5a8);
  uVar2 = *(ushort *)(lVar8 + 0x20 + (long)iVar3 * 0x28);
  uVar21 = (uint)uVar2;
  iVar23 = (rect->x1).m_i;
  iVar4 = (rect->y1).m_i;
  iVar13 = (rect->x2).m_i + 1;
  iVar24 = iVar13;
  if (bVar10) {
    iVar24 = iVar23;
  }
  iVar5 = (rect->y2).m_i;
  local_118.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)&local_128,index);
  local_138.ptr = local_118.ptr;
  local_148 = local_128;
  puStack_140 = puStack_120;
  local_158.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_168 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_160 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)&local_168,(QModelIndex *)&local_148);
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2f8))(this,&local_108);
  uVar22 = ~((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
            data)->widget_attributes & 1;
  bVar11 = QWidget::hasFocus((QWidget *)this);
  uVar17 = uVar22 + 0x10000;
  if (!bVar11) {
    uVar17 = uVar22;
  }
  local_170 = (QPoint)QPainter::brushOrigin();
  SVar14 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  if (SVar14 == ScrollPerPixel) {
    local_188.c = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                         super_QFrame.super_QWidget + 0x2b8))();
    local_188.r = 0;
    QPainter::setBrushOrigin(painter,(QPoint *)&local_188);
  }
  if (*(char *)(lVar7 + 0x42a) == '\x01') {
    local_108.features.super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
    super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
         (QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>)
         (((uint)local_108.features.
                 super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                 super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0xfffffffd) +
         (*(uint *)(lVar7 + 0x5d0) & 1) * 2);
  }
  uVar22 = bVar1 ^ 1;
  SVar15 = QAbstractItemView::selectionBehavior((QAbstractItemView *)this);
  if ((SVar15 == SelectRows) && (local_108.showDecorationSelected == true)) {
    QModelIndex::parent(&local_188,index);
    QPersistentModelIndex::parent();
    if ((local_188.r == local_1a0) &&
       (((local_188.c == local_19c &&
         (CONCAT44(local_188.i._4_4_,(undefined4)local_188.i) == local_198)) &&
        (local_188.m.ptr == local_190)))) {
      iVar6 = index->r;
      iVar16 = QPersistentModelIndex::row();
      bVar11 = iVar6 == iVar16;
      goto LAB_005438c7;
    }
  }
  bVar11 = false;
LAB_005438c7:
  puVar25 = (uint *)(lVar8 + (long)iVar3 * 0x28 + 0x1c);
  cVar12 = QItemSelectionModel::isSelected(*(QModelIndex **)(lVar7 + 0x328));
  QVar20.i = uVar17 | 0x8000;
  if (cVar12 == '\0') {
    QVar20.i = uVar17;
  }
  if (uVar2 < uVar22) {
    iVar23 = iVar18 + iVar24 + -1;
  }
  else {
    iVar24 = iVar13 - iVar18;
    if (bVar10) {
      iVar24 = iVar23;
    }
    iVar23 = iVar18 + -1 + iVar24;
    uVar17 = *puVar25;
    uVar17 = (uVar17 & 9) << 0x12 | (uVar17 & 4) << 0x11 | QVar20.i;
    if ((bVar11) || (iVar3 == *(int *)(lVar7 + 0x620))) {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)(uVar17 | 0x102000);
    }
    else {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)(uVar17 | 0x100000);
    }
    local_108.super_QStyleOption.rect.x1.m_i = iVar24;
    local_108.super_QStyleOption.rect.y1.m_i = iVar4;
    local_108.super_QStyleOption.rect.x2.m_i = iVar23;
    local_108.super_QStyleOption.rect.y2.m_i = iVar5;
    pQVar19 = QWidget::style((QWidget *)this);
    (**(code **)(*(long *)pQVar19 + 0xb0))(pQVar19,0x17,&local_108,painter,this);
  }
  iVar13 = -iVar18;
  if (bVar10) {
    iVar13 = iVar18;
  }
  do {
    if ((int)uVar21 <= (int)uVar22) {
      QPainter::setBrushOrigin(painter,&local_170);
      QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    uVar21 = uVar21 - 1;
    iVar24 = iVar24 + iVar13;
    iVar23 = iVar23 + iVar13;
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)QVar20.i;
    local_108.super_QStyleOption.rect.x1.m_i = iVar24;
    local_108.super_QStyleOption.rect.x2.m_i = iVar23;
    if ((*(long *)(lVar7 + 0x5e8) == 0) || (*(long *)(*(long *)(lVar7 + 0x5e8) + 8) == 0)) {
      local_108.super_QStyleOption.rect.y1.m_i = iVar4;
      local_108.super_QStyleOption.rect.y2.m_i = iVar5;
      iVar18 = (**(code **)(**(long **)(lVar7 + 0x2f8) + 0x78))
                         (*(long **)(lVar7 + 0x2f8),&local_168);
      if ((int)local_148 < iVar18 + -1) goto LAB_00543abe;
    }
    else {
      iVar18 = (*puVar25 >> 4) + iVar3 + 1;
      do {
        local_108.super_QStyleOption.rect.y1.m_i = iVar4;
        local_108.super_QStyleOption.rect.y2.m_i = iVar5;
        if (*(long *)(lVar7 + 0x5b0) <= (long)iVar18) goto LAB_00543aca;
        uVar9 = *(ulong *)(*(long *)(lVar7 + 0x5a8) + 0x1c + (long)iVar18 * 0x28);
        uVar17 = (uint)(uVar9 >> 0x20) & 0xffff;
        if (uVar17 < uVar21) goto LAB_00543aca;
        iVar18 = iVar18 + ((uint)(uVar9 >> 4) & 0xfffffff) + 1;
      } while (uVar17 != uVar21);
LAB_00543abe:
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           ((uint)local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
                  .super_QFlagsStorage<QStyle::StateFlag>.i | 0x200000);
    }
LAB_00543aca:
    if ((bVar11) || (iVar3 == *(int *)(lVar7 + 0x620))) {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           ((uint)local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
                  .super_QFlagsStorage<QStyle::StateFlag>.i | 0x2000);
    }
    else {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           ((uint)local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
                  .super_QFlagsStorage<QStyle::StateFlag>.i & 0xffffdfff);
    }
    pQVar19 = QWidget::style((QWidget *)this);
    (**(code **)(*(long *)pQVar19 + 0xb0))(pQVar19,0x17,&local_108,painter,this);
    local_138.ptr = local_158.ptr;
    local_148 = local_168;
    puStack_140 = uStack_160;
    QModelIndex::parent(&local_188,(QModelIndex *)&local_148);
    local_158.ptr = local_188.m.ptr;
    local_168 = (undefined1 *)CONCAT44(local_188.c,local_188.r);
    uStack_160 = (undefined1 *)CONCAT44(local_188.i._4_4_,(undefined4)local_188.i);
  } while( true );
}

Assistant:

void QTreeView::drawBranches(QPainter *painter, const QRect &rect,
                             const QModelIndex &index) const
{
    Q_D(const QTreeView);
    const bool reverse = isRightToLeft();
    const int indent = d->indent;
    const int outer = d->rootDecoration ? 0 : 1;
    const int item = d->current;
    const QTreeViewItem &viewItem = d->viewItems.at(item);
    int level = viewItem.level;
    QRect primitive(reverse ? rect.left() : rect.right() + 1, rect.top(), indent, rect.height());

    QModelIndex parent = index.parent();
    QModelIndex current = parent;
    QModelIndex ancestor = current.parent();

    QStyleOptionViewItem opt;
    initViewItemOption(&opt);
    QStyle::State extraFlags = QStyle::State_None;
    if (isEnabled())
        extraFlags |= QStyle::State_Enabled;
    if (hasFocus())
        extraFlags |= QStyle::State_Active;
    QPoint oldBO = painter->brushOrigin();
    if (verticalScrollMode() == QAbstractItemView::ScrollPerPixel)
        painter->setBrushOrigin(QPoint(0, verticalOffset()));

    if (d->alternatingColors) {
        opt.features.setFlag(QStyleOptionViewItem::Alternate, d->current & 1);
    }

    // When hovering over a row, pass State_Hover for painting the branch
    // indicators if it has the decoration (aka branch) selected.
    bool hoverRow = selectionBehavior() == QAbstractItemView::SelectRows
                    && opt.showDecorationSelected
                    && index.parent() == d->hover.parent()
                    && index.row() == d->hover.row();

    if (d->selectionModel->isSelected(index))
        extraFlags |= QStyle::State_Selected;

    if (level >= outer) {
        // start with the innermost branch
        primitive.moveLeft(reverse ? primitive.left() : primitive.left() - indent);
        opt.rect = primitive;

        const bool expanded = viewItem.expanded;
        const bool children = viewItem.hasChildren;
        bool moreSiblings = viewItem.hasMoreSiblings;

        opt.state = QStyle::State_Item | extraFlags
                    | (moreSiblings ? QStyle::State_Sibling : QStyle::State_None)
                    | (children ? QStyle::State_Children : QStyle::State_None)
                    | (expanded ? QStyle::State_Open : QStyle::State_None);
        opt.state.setFlag(QStyle::State_MouseOver, hoverRow || item == d->hoverBranch);

        style()->drawPrimitive(QStyle::PE_IndicatorBranch, &opt, painter, this);
    }
    // then go out level by level
    for (--level; level >= outer; --level) { // we have already drawn the innermost branch
        primitive.moveLeft(reverse ? primitive.left() + indent : primitive.left() - indent);
        opt.rect = primitive;
        opt.state = extraFlags;
        bool moreSiblings = false;
        if (d->hiddenIndexes.isEmpty()) {
            moreSiblings = (d->model->rowCount(ancestor) - 1 > current.row());
        } else {
            int successor = item + viewItem.total + 1;
            while (successor < d->viewItems.size()
                   && d->viewItems.at(successor).level >= uint(level)) {
                const QTreeViewItem &successorItem = d->viewItems.at(successor);
                if (successorItem.level == uint(level)) {
                    moreSiblings = true;
                    break;
                }
                successor += successorItem.total + 1;
            }
        }
        if (moreSiblings)
            opt.state |= QStyle::State_Sibling;
        opt.state.setFlag(QStyle::State_MouseOver, hoverRow || item == d->hoverBranch);

        style()->drawPrimitive(QStyle::PE_IndicatorBranch, &opt, painter, this);
        current = ancestor;
        ancestor = current.parent();
    }
    painter->setBrushOrigin(oldBO);
}